

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::GradientStroke::updateContent
          (GradientStroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  VRasterizer *pVVar1;
  CapStyle CVar2;
  JoinStyle JVar3;
  bool bVar4;
  pointer pVVar5;
  reference pfVar6;
  VDrawable *in_RDX;
  VDrawable *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar7;
  int in_stack_0000001c;
  unique_ptr<VGradient,_std::default_delete<VGradient>_> *in_stack_00000020;
  Gradient *in_stack_00000028;
  float *elm;
  iterator __end3;
  iterator __begin3;
  vector<float,_std::allocator<float>_> *__range3;
  float scale;
  float combinedAlpha;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff68;
  GradientStroke *in_stack_ffffffffffffff70;
  GradientStroke *this_00;
  float in_stack_ffffffffffffff78;
  undefined2 uVar8;
  JoinStyle join;
  CapStyle cap;
  undefined2 in_stack_ffffffffffffff98;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_48;
  VMatrix *in_stack_ffffffffffffffc0;
  VBrush local_38;
  float local_24;
  float local_20;
  VDrawable *local_18;
  
  uVar8 = (undefined2)in_XMM0_Da;
  join = (JoinStyle)((uint)in_XMM0_Da >> 0x10);
  cap = (CapStyle)((uint)in_XMM0_Da >> 0x18);
  local_18 = in_RDX;
  local_20 = internal::model::Gradient::opacity
                       (&in_stack_ffffffffffffff70->super_Gradient,
                        (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  local_20 = (float)CONCAT13(cap,CONCAT12(join,uVar8)) * local_20;
  internal::model::Gradient::update(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  pVVar5 = std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::operator->
                     ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x1644dd);
  VGradient::setAlpha(pVVar5,local_20);
  pVVar5 = std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::operator->
                     ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x164509);
  memcpy(&pVVar5->mMatrix,local_18,0x26);
  std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::operator->
            ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x164530);
  local_24 = VMatrix::scale(in_stack_ffffffffffffffc0);
  pVVar1 = &in_RDI->mRasterizer;
  std::unique_ptr<VGradient,_std::default_delete<VGradient>_>::get
            ((unique_ptr<VGradient,_std::default_delete<VGradient>_> *)0x16455f);
  VBrush::VBrush((VBrush *)local_18,
                 (VGradient *)CONCAT17(cap,CONCAT16(join,CONCAT24(uVar8,in_stack_ffffffffffffff78)))
                );
  VDrawable::setBrush((VDrawable *)
                      &(pVVar1->d).
                       super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,&local_38);
  CVar2 = internal::model::GradientStroke::capStyle((GradientStroke *)in_RDI[1].mName);
  JVar3 = internal::model::GradientStroke::joinStyle((GradientStroke *)in_RDI[1].mName);
  fVar7 = internal::model::GradientStroke::miterLimit((GradientStroke *)in_RDI[1].mName);
  internal::model::GradientStroke::width
            (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  VDrawable::setStrokeInfo
            (local_18,cap,join,in_stack_ffffffffffffff78,
             (float)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  bVar4 = internal::model::GradientStroke::hasDashInfo((GradientStroke *)0x16460d);
  if (bVar4) {
    _ZTWL11Dash_Vector();
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x164623);
    this_00 = (GradientStroke *)in_RDI[1].mName;
    _ZTWL11Dash_Vector();
    internal::model::GradientStroke::getDashInfo
              (this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (vector<float,_std::allocator<float>_> *)0x164652);
    _ZTWL11Dash_Vector();
    bVar4 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)local_18);
    if (!bVar4) {
      _ZTWL11Dash_Vector();
      local_48._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff68);
      std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffff68);
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)this_00,
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_ffffffffffffff68), bVar4) {
        pfVar6 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_48);
        *pfVar6 = local_24 * *pfVar6;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_48);
      }
      _ZTWL11Dash_Vector();
      VDrawable::setDashInfo
                (in_RDI,(vector<float,_std::allocator<float>_> *)
                        CONCAT44(fVar7,CONCAT13(JVar3,CONCAT12(CVar2,in_stack_ffffffffffffff98))));
    }
  }
  bVar4 = vIsZero(0.0);
  return (bool)((bVar4 ^ 0xffU) & 1);
}

Assistant:

bool renderer::GradientStroke::updateContent(int frameNo, const VMatrix &matrix,
                                             float alpha)
{
    float combinedAlpha = alpha * mData->opacity(frameNo);

    mData->update(mGradient, frameNo);
    mGradient->setAlpha(combinedAlpha);
    mGradient->mMatrix = matrix;
    auto scale = mGradient->mMatrix.scale();
    mDrawable.setBrush(VBrush(mGradient.get()));
    mDrawable.setStrokeInfo(mData->capStyle(), mData->joinStyle(),
                            mData->miterLimit(), mData->width(frameNo) * scale);

    if (mData->hasDashInfo()) {
        Dash_Vector.clear();
        mData->getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !vIsZero(combinedAlpha);
}